

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
               (string *s,char *fmt,char **v,char **args,Vector3<float> *args_1,
               Vector3<float> *args_2,Normal3<float> *args_3,Normal3<float> *args_4,
               Normal3<float> *args_5,Vector3<float> *args_6,Vector3<float> *args_7,
               Normal3<float> *args_8,Normal3<float> *args_9,char **args_10,char **args_11,
               Vector3<float> *args_12,Vector3<float> *args_13,float *args_14,float *args_15,
               float *args_16,float *args_17,int *args_18)

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  undefined8 *in_RDX;
  Normal3<float> *unaff_RBP;
  string *in_RDI;
  char *in_R8;
  char **in_R9;
  Normal3<float> *unaff_R15;
  Vector3<float> *unaff_retaddr;
  Vector3<float> *in_stack_00000008;
  Normal3<float> *in_stack_00000010;
  Normal3<float> *in_stack_00000018;
  char **in_stack_00000020;
  char **in_stack_00000028;
  Vector3<float> *in_stack_00000030;
  Vector3<float> *in_stack_00000038;
  float *in_stack_00000040;
  float *in_stack_00000048;
  float *in_stack_00000050;
  float *in_stack_00000058;
  int *in_stack_00000060;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffce0;
  char **in_stack_fffffffffffffce8;
  char **in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  int line;
  char *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  LogLevel level;
  string local_288 [32];
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [16];
  ostream local_210 [397];
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [8];
  Normal3<float> *in_stack_ffffffffffffff88;
  Vector3<float> *in_stack_ffffffffffffff90;
  Vector3<float> *in_stack_ffffffffffffff98;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(level,in_stack_fffffffffffffd68,line,in_stack_fffffffffffffd58);
  }
  if ((bool)local_83) {
    LogFatal(level,in_stack_fffffffffffffd68,line,in_stack_fffffffffffffd58);
  }
  if ((local_82 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      LogFatal(level,in_stack_fffffffffffffd68,line,in_stack_fffffffffffffd58);
    }
    std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::operator+=(in_RDI,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,(char *)*in_RDX);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_248 = std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::operator+=(in_RDI,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,in_stack_00000060);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}